

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:653:57)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:653:57)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  uint32_t uVar4;
  long *plVar5;
  undefined8 *puVar6;
  global_object *this_00;
  object *poVar7;
  uint *puVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  undefined8 extraout_RDX_02;
  bool bVar10;
  pointer pvVar11;
  value *rhs;
  uint uVar12;
  mjs *this_01;
  _Alloc_hider this_02;
  long lVar13;
  initializer_list<mjs::value> __l;
  initializer_list<mjs::value> __l_00;
  object_ptr o;
  wstring is;
  value kval;
  value callback;
  value res;
  value this_arg;
  allocator_type local_1b9;
  gc_heap_ptr_untyped local_1b8;
  undefined4 *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *local_1a0;
  gc_heap_ptr_untyped local_198;
  wstring local_188;
  value local_168;
  undefined4 local_140;
  double local_138;
  undefined4 local_118 [2];
  gc_heap_ptr_untyped local_110 [2];
  value *local_f0;
  value local_e8;
  value local_c0;
  vector<mjs::value,_std::allocator<mjs::value>_> local_98;
  value local_80;
  value local_58;
  
  local_198.heap_ = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  local_198.pos_ = (this->f).global.super_gc_heap_ptr_untyped.pos_;
  local_f0 = __return_storage_ptr__;
  if (local_198.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_198.heap_,&local_198);
  }
  plVar5 = (long *)gc_heap_ptr_untyped::get(&local_198);
  (**(code **)(*plVar5 + 0x88))(&local_1b8,plVar5,this_);
  puVar6 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1b8);
  local_c0.type_ = reference;
  local_c0._4_4_ = 0;
  local_c0.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x199af4;
  (**(code **)*puVar6)(&local_168,puVar6);
  uVar4 = to_uint32(&local_168);
  value::destroy(&local_168);
  pvVar11 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pvVar11 ==
      (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    pvVar11 = (pointer)&value::undefined;
  }
  value::value(&local_c0,pvVar11);
  this_00 = (global_object *)gc_heap_ptr_untyped::get(&local_198);
  plVar5 = (long *)gc_heap_ptr_untyped::get(&local_198);
  (**(code **)(*plVar5 + 0x60))(&local_168,plVar5);
  global_object::validate_type(this_00,&local_c0,(object_ptr *)&local_168,"function");
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
  pvVar11 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pvVar11 >> 3) * -0x3333333333333333)
      < 2) {
    rhs = (value *)&value::undefined;
  }
  else {
    rhs = pvVar11 + 1;
  }
  value::value(&local_58,rhs);
  if (uVar4 < 0x10000) {
    if (uVar4 == 0) {
      bVar10 = true;
    }
    else {
      local_1a0 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)CONCAT44(local_1a0._4_4_,uVar4);
      bVar2 = true;
      bVar10 = true;
      this_01 = (mjs *)0x0;
      uVar9 = extraout_RDX;
      do {
        index_string_abi_cxx11_(&local_188,this_01,(uint32_t)uVar9);
        poVar7 = (object *)gc_heap_ptr_untyped::get(&local_1b8);
        local_168._0_8_ = local_188._M_string_length;
        local_168.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)local_188._M_dataplus._M_p;
        bVar1 = object::has_property(poVar7,(wstring_view *)&local_168);
        if (bVar1) {
          puVar6 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1b8);
          local_168._0_8_ = local_188._M_string_length;
          local_168.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)local_188._M_dataplus._M_p;
          (**(code **)*puVar6)(&local_e8,puVar6,&local_168);
          value::value(&local_168,&local_e8);
          local_138 = (double)(int)this_01;
          local_140 = 3;
          local_118[0] = 5;
          local_110[0].heap_ = local_1b8.heap_;
          local_110[0].pos_ = local_1b8.pos_;
          if (local_1b8.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_1b8.heap_,local_110);
          }
          __l._M_len = 3;
          __l._M_array = &local_168;
          std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_98,__l,&local_1b9);
          call_function(&local_80,&local_c0,&local_58,&local_98);
          std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_98);
          lVar13 = 0x50;
          do {
            value::destroy((value *)((long)&local_168.type_ + lVar13));
            lVar13 = lVar13 + -0x28;
          } while (lVar13 != -0x28);
          bVar1 = to_boolean(&local_80);
          bVar10 = bVar2;
          if (!bVar1) {
            bVar10 = false;
          }
          value::destroy(&local_80);
          value::destroy(&local_e8);
          bVar1 = !bVar1;
          uVar9 = extraout_RDX_01;
          bVar2 = bVar10;
        }
        else {
          bVar1 = false;
          uVar9 = extraout_RDX_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity * 4 + 4
                         );
          uVar9 = extraout_RDX_02;
        }
        uVar12 = (int)this_01 + 1;
        this_01 = (mjs *)(ulong)uVar12;
      } while (!bVar1 && uVar12 != (uint)local_1a0);
    }
  }
  else {
    poVar7 = (object *)gc_heap_ptr_untyped::get(&local_1b8);
    object::enumerable_property_names
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&local_188,poVar7);
    local_1a0 = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_188._M_string_length;
    if (local_188._M_dataplus._M_p == (pointer)local_188._M_string_length) {
      bVar10 = true;
    }
    else {
      local_1a8 = local_118;
      bVar10 = true;
      this_02._M_p = local_188._M_dataplus._M_p;
      do {
        puVar8 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02._M_p);
        local_168.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)(puVar8 + 1);
        local_168._0_8_ = ZEXT48(*puVar8);
        uVar4 = index_value_from_string((wstring_view *)&local_168);
        if (uVar4 == 0xffffffff) {
          cVar3 = '\x06';
        }
        else {
          puVar6 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1b8);
          puVar8 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02._M_p);
          local_168.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)(puVar8 + 1);
          local_168._0_8_ = ZEXT48(*puVar8);
          (**(code **)*puVar6)(&local_e8,puVar6,&local_168);
          value::value(&local_168,&local_e8);
          local_138 = (double)uVar4;
          local_140 = 3;
          local_118[0] = 5;
          local_110[0].heap_ = local_1b8.heap_;
          local_110[0].pos_ = local_1b8.pos_;
          if (local_1b8.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_1b8.heap_,local_110);
          }
          __l_00._M_len = 3;
          __l_00._M_array = &local_168;
          std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_98,__l_00,&local_1b9);
          call_function(&local_80,&local_c0,&local_58,&local_98);
          std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_98);
          lVar13 = 0x50;
          do {
            value::destroy((value *)((long)&local_168.type_ + lVar13));
            lVar13 = lVar13 + -0x28;
          } while (lVar13 != -0x28);
          bVar2 = to_boolean(&local_80);
          if (!bVar2) {
            bVar10 = false;
          }
          value::destroy(&local_80);
          value::destroy(&local_e8);
          cVar3 = !bVar2 * '\x05';
        }
      } while (((cVar3 == '\x06') || (cVar3 == '\0')) &&
              (this_02._M_p = this_02._M_p + 0x10,
              (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)this_02._M_p != local_1a0));
    }
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&local_188);
  }
  value::destroy(&local_58);
  value::destroy(&local_c0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_198);
  local_f0->type_ = boolean;
  (local_f0->field_1).b_ = bVar10;
  return local_f0;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }